

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_as_canonical_extended_json_dbpointer(void)

{
  byte bVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  char *__s1;
  char *__s2;
  ushort **ppuVar4;
  char *pcVar5;
  char *f;
  char *__bb;
  char *__aa;
  char *__b;
  char *__a;
  size_t i;
  char *str;
  size_t len;
  bson_t *b;
  bson_oid_t oid;
  
  bson_oid_init_from_string((long)&b + 4,"12341234123412abcdababcd");
  len = bson_new();
  bVar1 = bson_append_dbpointer(len,"p",1,"coll",(long)&b + 4);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x27f,"test_bson_as_canonical_extended_json_dbpointer",
            "BSON_APPEND_DBPOINTER (b, \"p\", \"coll\", &oid)");
    abort();
  }
  __s = (char *)bson_as_canonical_extended_json(len,&str);
  __a = (char *)0x0;
  __aa = 
  "{ \"p\" : { \"$dbPointer\" : { \"$ref\" : \"coll\", \"$id\" : { \"$oid\" : \"12341234123412abcdababcd\" } } } }"
  ;
  sVar3 = strlen(__s);
  __s1 = (char *)bson_malloc0(sVar3 + 1);
  sVar3 = strlen(
                "{ \"p\" : { \"$dbPointer\" : { \"$ref\" : \"coll\", \"$id\" : { \"$oid\" : \"12341234123412abcdababcd\" } } } }"
                );
  __s2 = (char *)bson_malloc0(sVar3 + 1);
  __b = __s;
  do {
    while (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)*__b] & 0x2000) != 0) {
      __b = __b + 1;
    }
    pcVar5 = __b + 1;
    __s1[(long)__a] = *__b;
    __b = pcVar5;
    __a = __a + 1;
  } while (*pcVar5 != '\0');
  __a = (char *)0x0;
  do {
    while (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)*__aa] & 0x2000) != 0) {
      __aa = __aa + 1;
    }
    pcVar5 = __aa + 1;
    __s2[(long)__a] = *__aa;
    __aa = pcVar5;
    __a = __a + 1;
  } while (*pcVar5 != '\0');
  iVar2 = strcmp(__s1,__s2);
  if (iVar2 == 0) {
    bson_free(__s1);
    bson_free(__s2);
    bson_free(__s);
    bson_destroy(len);
    return;
  }
  fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n%s:%d  %s()\n",__s1,__s2,
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          0x284,"test_bson_as_canonical_extended_json_dbpointer");
  abort();
}

Assistant:

static void
test_bson_as_canonical_extended_json_dbpointer (void)
{
   bson_oid_t oid;
   bson_t *b;
   size_t len;
   char *str;

   bson_oid_init_from_string (&oid, "12341234123412abcdababcd");
   b = bson_new ();
   BSON_ASSERT (BSON_APPEND_DBPOINTER (b, "p", "coll", &oid));
   str = bson_as_canonical_extended_json (b, &len);
   ASSERT_CMPJSON (str,
                   "{ \"p\" : { \"$dbPointer\" : { \"$ref\" : "
                   "\"coll\", \"$id\" : { \"$oid\" : "
                   "\"12341234123412abcdababcd\" } } } }");

   bson_destroy (b);
}